

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureDataBuffer
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLuint clear_value)

{
  uint *puVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  DataBufferVec *this_00;
  int iVar9;
  GLuint GVar10;
  uint uVar11;
  int iVar12;
  GLuint GVar13;
  uint uVar14;
  GLuint GVar15;
  GLuint local_4c;
  TextureCubeMapArraySubImage3D *local_48;
  DataBufferVec *local_40;
  ulong local_38;
  
  local_40 = &this->m_copy_data_buffer;
  local_4c = clear_value;
  local_48 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (local_40,(ulong)(copy_params->m_width * copy_params->m_height * copy_params->m_depth *
                             4),&local_4c);
  uVar11 = copy_params->m_zoffset;
  GVar13 = copy_params->m_depth;
  if (uVar11 < GVar13 + uVar11) {
    uVar6 = copy_params->m_yoffset;
    GVar10 = copy_params->m_height;
    uVar14 = uVar11 * height;
    iVar3 = 0;
    uVar4 = uVar11;
    uVar5 = uVar6;
    do {
      if (uVar6 < GVar10 + uVar6) {
        puVar2 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        GVar13 = copy_params->m_xoffset;
        GVar15 = copy_params->m_width;
        iVar12 = (uVar6 + uVar14) * width * 4;
        do {
          if (GVar13 < GVar15 + GVar13) {
            iVar9 = iVar12 + GVar13 * 4;
            do {
              iVar8 = iVar3;
              iVar3 = 0;
              do {
                puVar2[(uint)(iVar3 + iVar8)] = iVar9 + iVar3;
                iVar3 = iVar3 + 1;
              } while (iVar3 != 4);
              GVar13 = GVar13 + 1;
              GVar15 = copy_params->m_width;
              iVar9 = iVar9 + 4;
              iVar3 = iVar8 + 4;
            } while (GVar13 < GVar15 + copy_params->m_xoffset);
            uVar5 = copy_params->m_yoffset;
            GVar10 = copy_params->m_height;
            iVar3 = iVar8 + 4;
            GVar13 = copy_params->m_xoffset;
          }
          uVar6 = uVar6 + 1;
          iVar12 = iVar12 + width * 4;
        } while (uVar6 < GVar10 + uVar5);
        uVar11 = copy_params->m_zoffset;
        GVar13 = copy_params->m_depth;
        uVar6 = uVar5;
        local_38 = (ulong)uVar14;
      }
      uVar4 = uVar4 + 1;
      uVar14 = uVar14 + height;
    } while (uVar4 < GVar13 + uVar11);
  }
  this_00 = &local_48->m_expected_data_buffer;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (this_00,(ulong)(height * width * depth * 4),&local_4c);
  uVar11 = copy_params->m_zoffset;
  GVar13 = copy_params->m_depth;
  if (uVar11 < GVar13 + uVar11) {
    uVar6 = copy_params->m_yoffset;
    GVar10 = copy_params->m_height;
    iVar3 = uVar11 * height;
    uVar5 = uVar6;
    uVar4 = uVar11;
    do {
      if (uVar5 < GVar10 + uVar5) {
        puVar2 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        GVar13 = copy_params->m_xoffset;
        GVar15 = copy_params->m_width;
        iVar12 = (uVar5 + iVar3) * width;
        do {
          if (GVar13 < GVar15 + GVar13) {
            uVar7 = (ulong)GVar13;
            uVar11 = (GVar13 + iVar12) * 4;
            do {
              puVar1 = puVar2 + uVar11;
              *puVar1 = uVar11;
              puVar1[1] = uVar11 | 1;
              puVar1[2] = uVar11 | 2;
              puVar1[3] = uVar11 | 3;
              uVar7 = uVar7 + 1;
              GVar13 = copy_params->m_xoffset;
              GVar15 = copy_params->m_width;
              uVar11 = uVar11 + 4;
            } while (uVar7 < GVar15 + GVar13);
            uVar6 = copy_params->m_yoffset;
            GVar10 = copy_params->m_height;
          }
          uVar5 = uVar5 + 1;
          iVar12 = iVar12 + width;
        } while (uVar5 < GVar10 + uVar6);
        uVar11 = copy_params->m_zoffset;
        GVar13 = copy_params->m_depth;
        uVar5 = uVar6;
      }
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + height;
    } while (uVar4 < GVar13 + uVar11);
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureDataBuffer(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														const SubImage3DCopyParams& copy_params,
														glw::GLuint					clear_value)
{
	glw::GLuint index = 0;

	m_copy_data_buffer.assign(copy_params.m_width * copy_params.m_height * copy_params.m_depth * m_n_components,
							  clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					m_copy_data_buffer[index++] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}

	m_expected_data_buffer.assign(width * height * depth * m_n_components, clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				glw::GLuint* data_pointer =
					&m_expected_data_buffer[(zoffset * width * height + yoffset * width + xoffset) * m_n_components];
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					data_pointer[component] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}
}